

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# labeling_lee_2021_brts_no_zeroinit.h
# Opt level: O3

double __thiscall BRTS_XZ<UFPC>::Get_RunAllocTime(BRTS_XZ<UFPC> *this)

{
  double dVar1;
  double dVar2;
  double dVar3;
  long lVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  
  lVar4 = cv::getTickCount();
  (this->super_Labeling2D<(Connectivity2D)8,_false>).super_Labeling.perf_.counter_.last =
       (double)lVar4;
  lVar4 = cv::getTickCount();
  dVar3 = (this->super_Labeling2D<(Connectivity2D)8,_false>).super_Labeling.perf_.tick_frequency_;
  dVar1 = (double)lVar4 -
          (this->super_Labeling2D<(Connectivity2D)8,_false>).super_Labeling.perf_.counter_.last;
  (this->super_Labeling2D<(Connectivity2D)8,_false>).super_Labeling.perf_.counter_.last = dVar1;
  (this->super_Labeling2D<(Connectivity2D)8,_false>).super_Labeling.perf_.counter_.total =
       (this->super_Labeling2D<(Connectivity2D)8,_false>).super_Labeling.perf_.counter_.total +
       dVar1;
  lVar4 = cv::getTickCount();
  (this->super_Labeling2D<(Connectivity2D)8,_false>).super_Labeling.perf_.counter_.last =
       (double)lVar4;
  lVar4 = cv::getTickCount();
  dVar2 = (double)lVar4 -
          (this->super_Labeling2D<(Connectivity2D)8,_false>).super_Labeling.perf_.counter_.last;
  (this->super_Labeling2D<(Connectivity2D)8,_false>).super_Labeling.perf_.counter_.last = dVar2;
  auVar5._0_8_ = dVar1 * 1000.0;
  auVar5._8_8_ = dVar2 * 1000.0;
  (this->super_Labeling2D<(Connectivity2D)8,_false>).super_Labeling.perf_.counter_.total =
       dVar2 + (this->super_Labeling2D<(Connectivity2D)8,_false>).super_Labeling.perf_.counter_.
               total;
  dVar1 = (this->super_Labeling2D<(Connectivity2D)8,_false>).super_Labeling.perf_.tick_frequency_;
  auVar6._8_4_ = SUB84(dVar1,0);
  auVar6._0_8_ = dVar3;
  auVar6._12_4_ = (int)((ulong)dVar1 >> 0x20);
  auVar6 = divpd(auVar5,auVar6);
  return auVar6._0_8_ - auVar6._8_8_;
}

Assistant:

double Get_RunAllocTime() {
        Run* run_start = data_runs.runs;
        Run* run_end = run_start;
        for (size_t i = 0; i < data_runs.height; i++, run_end++) {
            for (; run_end->start_pos != 0xFFFF; run_end++);
        }
        size_t size_used = (size_t)run_end - (size_t)run_start;

        Runs runs_temp;
        perf_.start();
        runs_temp.Alloc(data_runs.height, data_runs.width);
        memset(runs_temp.runs, 0, size_used);
        perf_.stop();
        double t = perf_.last();

        perf_.start();
        memset(runs_temp.runs, 0, size_used);
        perf_.stop();
        double t_result = t - perf_.last();

        runs_temp.Dealloc();
        return t_result;
    }